

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix2 * matrix2_multiply(matrix2 *self,matrix2 *mT)

{
  anon_union_32_5_d0a4420b_for_matrix2_0 local_28;
  
  local_28.m[0] =
       (mT->field_0).m[0] * (self->field_0).m[0] + (mT->field_0).m[1] * (self->field_0).m[2];
  local_28.m[1] =
       (mT->field_0).m[0] * (self->field_0).m[1] + (mT->field_0).m[1] * (self->field_0).m[3];
  local_28.m[2] =
       (mT->field_0).m[2] * (self->field_0).m[0] + (mT->field_0).m[3] * (self->field_0).m[2];
  local_28.m[3] =
       (mT->field_0).m[2] * (self->field_0).m[1] + (mT->field_0).m[3] * (self->field_0).m[3];
  matrix2_set(self,(matrix2 *)&local_28.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_multiply(struct matrix2 *self, const struct matrix2 *mT)
{
	/* mT is the multiplicand */

	struct matrix2 r;

	matrix2_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11;

	matrix2_set(self, &r); /* overwrite/save it */

	return self;
}